

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcUif.c
# Opt level: O2

int Wlc_NtkPairIsUifable(Wlc_Ntk_t *p,Wlc_Obj_t *pObj,Wlc_Obj_t *pObj2)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Wlc_Obj_t *pWVar4;
  Wlc_Obj_t *pWVar5;
  int iVar6;
  
  iVar1 = pObj->End - pObj->Beg;
  iVar6 = -iVar1;
  if (0 < iVar1) {
    iVar6 = iVar1;
  }
  iVar2 = pObj2->End - pObj2->Beg;
  iVar1 = -iVar2;
  if (0 < iVar2) {
    iVar1 = iVar2;
  }
  iVar2 = 0;
  if (((iVar6 == iVar1) && (((*(ushort *)pObj2 ^ *(ushort *)pObj) & 0x40) == 0)) &&
     (pObj->nFanins == pObj2->nFanins)) {
    iVar6 = 0;
    while (iVar6 < (int)pObj->nFanins) {
      pWVar4 = Wlc_ObjFanin(p,pObj,iVar6);
      pWVar5 = Wlc_ObjFanin(p,pObj2,iVar6);
      iVar2 = pWVar4->End - pWVar4->Beg;
      iVar1 = -iVar2;
      if (0 < iVar2) {
        iVar1 = iVar2;
      }
      iVar3 = pWVar5->End - pWVar5->Beg;
      iVar2 = -iVar3;
      if (0 < iVar3) {
        iVar2 = iVar3;
      }
      if (iVar1 != iVar2) {
        return 0;
      }
      iVar6 = iVar6 + 1;
      if (((*(ushort *)pWVar5 ^ *(ushort *)pWVar4) & 0x40) != 0) {
        return 0;
      }
    }
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int Wlc_NtkPairIsUifable( Wlc_Ntk_t * p, Wlc_Obj_t * pObj, Wlc_Obj_t * pObj2 )
{
    Wlc_Obj_t * pFanin, * pFanin2;  int k;
    if ( Wlc_ObjRange(pObj) != Wlc_ObjRange(pObj2) )
        return 0;
    if ( Wlc_ObjIsSigned(pObj) != Wlc_ObjIsSigned(pObj2) )
        return 0;
    if ( Wlc_ObjFaninNum(pObj) != Wlc_ObjFaninNum(pObj2) )
        return 0;
    for ( k = 0; k < Wlc_ObjFaninNum(pObj); k++ )
    {
        pFanin = Wlc_ObjFanin(p, pObj, k);
        pFanin2 = Wlc_ObjFanin(p, pObj2, k);
        if ( Wlc_ObjRange(pFanin) != Wlc_ObjRange(pFanin2) )
            return 0;
        if ( Wlc_ObjIsSigned(pFanin) != Wlc_ObjIsSigned(pFanin2) )
            return 0;
    }
    return 1;
}